

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cc
# Opt level: O2

bool __thiscall
flow::diagnostics::BufferedReport::operator==(BufferedReport *this,BufferedReport *other)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  
  lVar2 = (long)(this->messages_).
                super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->messages_).
                super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar2 == (long)(other->messages_).
                     super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(other->messages_).
                     super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                     ._M_impl.super__Vector_impl_data._M_start) {
    lVar3 = lVar2 / 0x60 + 1;
    lVar2 = 0;
    do {
      lVar3 = lVar3 + -1;
      bVar4 = lVar3 == 0;
      if (bVar4) {
        return bVar4;
      }
      bVar1 = Message::operator!=((Message *)
                                  ((long)&((this->messages_).
                                           super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->type + lVar2)
                                  ,(Message *)
                                   ((long)&((other->messages_).
                                            super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->type + lVar2
                                   ));
      lVar2 = lVar2 + 0x60;
    } while (!bVar1);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool BufferedReport::operator==(const BufferedReport& other) const noexcept {
  if (size() != other.size())
    return false;

  for (size_t i = 0, e = size(); i != e; ++i)
    if (messages_[i] != other.messages_[i])
      return false;

  return true;
}